

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int element5(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  ENCODING *enc_local;
  char *end_local;
  char *ptr_local;
  int tok_local;
  PROLOG_STATE *state_local;
  
  if (tok == 0xf) {
    state_local._4_4_ = 0;
  }
  else if (tok == 0x15) {
    state->handler = element4;
    state_local._4_4_ = 0;
  }
  else if (tok == 0x24) {
    state->handler = declClose;
    state_local._4_4_ = 0x29;
  }
  else {
    state_local._4_4_ = common(state,tok);
  }
  return state_local._4_4_;
}

Assistant:

static
int element5(PROLOG_STATE *state,
             int tok,
             const char *ptr,
             const char *end,
             const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_CLOSE_PAREN_ASTERISK:
    state->handler = declClose;
    return XML_ROLE_GROUP_CLOSE_REP;
  case XML_TOK_OR:
    state->handler = element4;
    return XML_ROLE_NONE;
  }
  return common(state, tok);
}